

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

bool __thiscall
HighsHashTable<int,std::pair<double,int>>::insert<HighsHashTableEntry<int,std::pair<double,int>>>
          (HighsHashTable<int,_std::pair<double,_int>_> *this,
          HighsHashTableEntry<int,_std::pair<double,_int>_> *args)

{
  ulong uVar1;
  bool bVar2;
  pointer pHVar3;
  type puVar4;
  ulong uVar5;
  u64 uVar6;
  u64 uVar7;
  HighsHashTable<int,_std::pair<double,_int>_> *in_RSI;
  HighsHashTable<int,_std::pair<double,_int>_> *in_RDI;
  u64 distanceOfCurrentOccupant;
  u64 currentDistance;
  Entry *entryArray;
  u8 meta;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  Entry entry;
  size_t in_stack_ffffffffffffff78;
  HighsHashTable<int,_std::pair<double,_int>_> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined7 in_stack_ffffffffffffffb0;
  uchar in_stack_ffffffffffffffb7;
  u64 *in_stack_ffffffffffffffb8;
  HighsHashTable<int,_std::pair<double,_int>_> *in_stack_ffffffffffffffc0;
  u64 *in_stack_ffffffffffffffc8;
  _Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false> key;
  HighsHashTable<int,_std::pair<double,_int>_> *this_00;
  HighsHashTableEntry<int,_std::pair<double,_int>_> *args_00;
  bool local_1;
  
  key._M_head_impl =
       (in_RSI->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>.
       _M_head_impl;
  this_00 = (HighsHashTable<int,_std::pair<double,_int>_> *)
            (in_RSI->metadata)._M_t.
            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  args_00 = (HighsHashTableEntry<int,_std::pair<double,_int>_> *)in_RSI->tableSizeMask;
  HighsHashTableEntry<int,_std::pair<double,_int>_>::key
            ((HighsHashTableEntry<int,_std::pair<double,_int>_> *)&stack0xffffffffffffffd0);
  bVar2 = HighsHashTable<int,_std::pair<double,_int>_>::findPosition
                    (this_00,&(key._M_head_impl)->key_,(u8 *)in_stack_ffffffffffffffc8,
                     (u64 *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     (u64 *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  if (bVar2) {
    local_1 = false;
  }
  else if ((in_RDI->numElements == (in_RDI->tableSizeMask + 1) * 7 >> 3) ||
          (in_stack_ffffffffffffffc8 == in_stack_ffffffffffffffb8)) {
    HighsHashTable<int,_std::pair<double,_int>_>::growTable
              ((HighsHashTable<int,_std::pair<double,_int>_> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    local_1 = insert<HighsHashTableEntry<int,std::pair<double,int>>>(in_RSI,args_00);
  }
  else {
    pHVar3 = std::
             unique_ptr<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
             ::get(&in_stack_ffffffffffffff80->entries);
    in_RDI->numElements = in_RDI->numElements + 1;
    do {
      puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      bVar2 = HighsHashTable<int,_std::pair<double,_int>_>::occupied(in_RDI,*puVar4);
      if (!bVar2) {
        puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        *puVar4 = in_stack_ffffffffffffffb7;
        pHVar3 = pHVar3 + (long)in_stack_ffffffffffffffc8;
        *(HighsHashTableEntry<int,_std::pair<double,_int>_> **)pHVar3 = key._M_head_impl;
        (pHVar3->value_).first = (double)this_00;
        *(HighsHashTableEntry<int,_std::pair<double,_int>_> **)&(pHVar3->value_).second = args_00;
        return true;
      }
      uVar5 = (long)in_stack_ffffffffffffffc8 - (long)in_stack_ffffffffffffffc0;
      uVar1 = in_RDI->tableSizeMask;
      uVar6 = HighsHashTable<int,_std::pair<double,_int>_>::distanceFromIdealSlot
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (uVar6 < (uVar5 & uVar1)) {
        std::swap<HighsHashTableEntry<int,std::pair<double,int>>>
                  ((HighsHashTableEntry<int,_std::pair<double,_int>_> *)in_RDI,
                   (HighsHashTableEntry<int,_std::pair<double,_int>_> *)
                   CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
        puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        std::swap<unsigned_char>(&stack0xffffffffffffffb7,puVar4);
        in_stack_ffffffffffffff80 =
             (HighsHashTable<int,_std::pair<double,_int>_> *)
             ((long)in_stack_ffffffffffffffc8 - uVar6 & in_RDI->tableSizeMask);
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffff80;
        uVar7 = HighsHashTable<int,_std::pair<double,_int>_>::maxDistance();
        in_stack_ffffffffffffffb8 =
             (u64 *)((long)&(in_stack_ffffffffffffff80->entries)._M_t.
                            super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                            .
                            super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>
                            ._M_head_impl + uVar7 & in_RDI->tableSizeMask);
      }
      in_stack_ffffffffffffffc8 =
           (u64 *)((long)in_stack_ffffffffffffffc8 + 1U & in_RDI->tableSizeMask);
    } while (in_stack_ffffffffffffffc8 != in_stack_ffffffffffffffb8);
    HighsHashTable<int,_std::pair<double,_int>_>::growTable
              ((HighsHashTable<int,_std::pair<double,_int>_> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    insert<HighsHashTableEntry<int,std::pair<double,int>>>(in_RSI,args_00);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }